

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

CommissionerDataset * __thiscall
ot::commissioner::CommissionerApp::MakeDefaultCommissionerDataset
          (CommissionerDataset *__return_storage_ptr__,CommissionerApp *this)

{
  byte *pbVar1;
  int iVar2;
  
  __return_storage_ptr__->mBorderAgentLocator = 0;
  __return_storage_ptr__->mSessionId = 0;
  (__return_storage_ptr__->mNmkpSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->mJoinerUdpPort = 0;
  __return_storage_ptr__->mAeUdpPort = 0;
  __return_storage_ptr__->mNmkpUdpPort = 0;
  __return_storage_ptr__->mPresentFlags = 0;
  (__return_storage_ptr__->mSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->mSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->mSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mAeSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->mAeSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->mAeSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mNmkpSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->mNmkpSteeringData).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __return_storage_ptr__->mJoinerUdpPort = 1000;
  pbVar1 = (byte *)((long)&__return_storage_ptr__->mPresentFlags + 1);
  *pbVar1 = *pbVar1 | 4;
  iVar2 = (*((this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_Commissioner[10])();
  if ((char)iVar2 != '\0') {
    __return_storage_ptr__->mAeUdpPort = 0x3e9;
    __return_storage_ptr__->mNmkpUdpPort = 0x3ea;
    pbVar1 = (byte *)((long)&__return_storage_ptr__->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 3;
  }
  return __return_storage_ptr__;
}

Assistant:

CommissionerDataset CommissionerApp::MakeDefaultCommissionerDataset() const
{
    CommissionerDataset dataset;

    dataset.mJoinerUdpPort = kDefaultJoinerUdpPort;
    dataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;

    if (IsCcmMode())
    {
        dataset.mAeUdpPort = kDefaultAeUdpPort;
        dataset.mPresentFlags |= CommissionerDataset::kAeUdpPortBit;
        dataset.mNmkpUdpPort = kDefaultNmkpUdpPort;
        dataset.mPresentFlags |= CommissionerDataset::kNmkpUdpPortBit;
    }

    return dataset;
}